

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipc.c
# Opt level: O1

pchar * p_ipc_unix_get_temp_dir(void)

{
  psize pVar1;
  pchar *__s;
  size_t sVar2;
  psize pVar3;
  char *__dest;
  
  __s = p_strdup("/tmp");
  sVar2 = strlen(__s);
  pVar1 = sVar2 + 3;
  do {
    pVar3 = pVar1;
    pVar1 = pVar3 - 1;
  } while (__s[pVar3 - 4] == '/');
  __s[pVar3 - 3] = '\0';
  __dest = (char *)p_malloc0(pVar3 - 1);
  if (__dest == (char *)0x0) {
    p_free(__s);
    __dest = (char *)0x0;
  }
  else {
    strcpy(__dest,__s);
    sVar2 = strlen(__dest);
    (__dest + sVar2)[0] = '/';
    (__dest + sVar2)[1] = '\0';
  }
  return __dest;
}

Assistant:

pchar *
p_ipc_unix_get_temp_dir (void)
{
	pchar	*str, *ret;
	psize	len;

#ifdef P_tmpdir
	if (strlen (P_tmpdir) > 0)
		str = p_strdup (P_tmpdir);
	else
		return p_strdup ("/tmp/");
#else
	const pchar *tmp_env;

	tmp_env = getenv ("TMPDIR");

	if (tmp_env != NULL)
		str = p_strdup (tmp_env);
	else
		return p_strdup ("/tmp/");
#endif /* P_tmpdir */

	/* Now we need to ensure that we have only the one trailing slash */
	len = strlen (str);
	while (*(str + --len) == '/')
		;
	*(str + ++len) = '\0';

	/* len + / + zero symbol */
	if (P_UNLIKELY ((ret = p_malloc0 (len + 2)) == NULL)) {
		p_free (str);
		return NULL;
	}

	strcpy (ret, str);
	strcat (ret, "/");

	return ret;
}